

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

long duckdb::BinaryLambdaWrapper::
     Operation<duckdb::DamerauLevenshteinFunction(duckdb::DataChunk&,duckdb::ExpressionState&,duckdb::Vector&)::__0,bool,duckdb::string_t,duckdb::string_t,long>
               (anon_class_8_1_6971b95b fun,string_t left,string_t right,ValidityMask *mask,
               idx_t idx)

{
  size_type __n;
  size_type __n_00;
  value_type vVar1;
  mapped_type_conflict mVar2;
  reference pvVar3;
  reference pvVar4;
  mapped_type_conflict *pmVar5;
  ulong uVar6;
  long lVar7;
  size_type sVar8;
  ulong uVar9;
  size_type sVar10;
  value_type vVar11;
  ulong uVar12;
  key_type_conflict1 *__k;
  size_type sVar13;
  bool bVar14;
  vector<duckdb::vector<unsigned_long,_true>,_true> distance;
  idx_t inf;
  allocator_type local_102;
  allocator_type local_101;
  size_type local_100;
  long local_f8;
  long local_f0;
  mapped_type_conflict local_e8;
  vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
  local_e0;
  long local_c8;
  char *local_c0;
  size_type local_b8;
  mapped_type_conflict local_b0;
  ulong local_a8;
  size_type local_a0;
  mapped_type_conflict local_98;
  mapped_type_conflict local_90;
  undefined8 local_88;
  long local_80;
  undefined8 local_78;
  long local_70;
  _Rb_tree<char,_std::pair<const_char,_unsigned_long>,_std::_Select1st<std::pair<const_char,_unsigned_long>_>,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
  local_68;
  value_type_conflict2 local_38;
  
  local_80 = right.value._0_8_;
  local_88 = left.value._8_8_;
  local_70 = left.value._0_8_;
  uVar9 = (ulong)left.value._8_4_;
  uVar12 = (ulong)fun.result & 0xffffffff;
  vVar11 = uVar9;
  if ((uVar12 != 0) && (vVar11 = uVar12, uVar9 != 0)) {
    local_f8 = local_70;
    if ((uint)fun.result < 0xd) {
      local_f8 = (long)&local_78 + 4;
    }
    local_f0 = local_80;
    if (left.value._8_4_ < 0xd) {
      local_f0 = (long)&local_88 + 4;
    }
    local_38 = uVar12 + 1 + uVar9;
    local_78 = fun.result;
    ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_68,uVar9 + 2,
               &local_38,&local_101);
    ::std::
    vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
    ::vector(&local_e0,uVar12 + 2,(value_type *)&local_68,&local_102);
    if ((void *)local_68._M_impl._0_8_ != (void *)0x0) {
      operator_delete((void *)local_68._M_impl._0_8_);
    }
    local_68._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_68._M_impl.super__Rb_tree_header._M_header;
    local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
    sVar13 = 0;
    local_68._M_impl.super__Rb_tree_header._M_header._M_right =
         local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      __n = sVar13 + 1;
      pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::operator[]
                         ((vector<duckdb::vector<unsigned_long,_true>,_true> *)&local_e0,__n);
      pvVar4 = vector<unsigned_long,_true>::operator[](pvVar3,1);
      *pvVar4 = sVar13;
      sVar13 = __n;
    } while (uVar12 + 1 != __n);
    local_c8 = -(uVar9 + (uVar9 == 0));
    sVar10 = 1;
    do {
      pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::operator[]
                         ((vector<duckdb::vector<unsigned_long,_true>,_true> *)&local_e0,1);
      sVar8 = sVar10 + 1;
      pvVar4 = vector<unsigned_long,_true>::operator[](pvVar3,sVar8);
      *pvVar4 = sVar10;
      sVar10 = sVar8;
    } while (local_c8 + sVar8 != 1);
    local_98 = uVar12 + (uVar12 == 0);
    local_e8 = 0;
    local_a8 = uVar9;
    local_a0 = uVar12 + 1;
    do {
      local_c0 = (char *)(local_f8 + local_e8);
      local_b8 = local_e8 + 2;
      local_100 = 0;
      sVar10 = 1;
      mVar2 = local_e8 + 1;
      local_90 = local_e8;
      do {
        local_e8 = mVar2;
        __k = (key_type_conflict1 *)(local_f0 + sVar10 + -1);
        pmVar5 = ::std::
                 map<char,_unsigned_long,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
                 ::operator[]((map<char,_unsigned_long,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
                               *)&local_68,__k);
        local_b0 = *pmVar5;
        bVar14 = *local_c0 != *__k;
        sVar8 = sVar10;
        if (bVar14) {
          sVar8 = local_100;
        }
        pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::operator[]
                           ((vector<duckdb::vector<unsigned_long,_true>,_true> *)&local_e0,local_e8)
        ;
        pvVar4 = vector<unsigned_long,_true>::operator[](pvVar3,sVar10);
        uVar9 = (ulong)bVar14 + *pvVar4;
        pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::operator[]
                           ((vector<duckdb::vector<unsigned_long,_true>,_true> *)&local_e0,local_b8)
        ;
        pvVar4 = vector<unsigned_long,_true>::operator[](pvVar3,sVar10);
        vVar11 = *pvVar4;
        pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::operator[]
                           ((vector<duckdb::vector<unsigned_long,_true>,_true> *)&local_e0,local_e8)
        ;
        __n_00 = sVar10 + 1;
        pvVar4 = vector<unsigned_long,_true>::operator[](pvVar3,__n_00);
        vVar1 = *pvVar4;
        pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::operator[]
                           ((vector<duckdb::vector<unsigned_long,_true>,_true> *)&local_e0,local_b0)
        ;
        pvVar4 = vector<unsigned_long,_true>::operator[](pvVar3,local_100);
        uVar6 = ((*pvVar4 - local_100) - local_b0) + local_90 + sVar10;
        uVar12 = vVar1 + 1;
        if (uVar6 <= vVar1 + 1) {
          uVar12 = uVar6;
        }
        uVar6 = vVar11 + 1;
        if (uVar12 <= vVar11 + 1) {
          uVar6 = uVar12;
        }
        if (uVar6 <= uVar9) {
          uVar9 = uVar6;
        }
        pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::operator[]
                           ((vector<duckdb::vector<unsigned_long,_true>,_true> *)&local_e0,local_b8)
        ;
        pvVar4 = vector<unsigned_long,_true>::operator[](pvVar3,__n_00);
        *pvVar4 = uVar9;
        lVar7 = local_c8 + sVar10;
        sVar10 = __n_00;
        local_100 = sVar8;
        mVar2 = local_e8;
      } while (lVar7 != 0);
      pmVar5 = ::std::
               map<char,_unsigned_long,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
               ::operator[]((map<char,_unsigned_long,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
                             *)&local_68,local_c0);
      *pmVar5 = local_e8;
    } while (local_e8 != local_98);
    pvVar3 = vector<duckdb::vector<unsigned_long,_true>,_true>::operator[]
                       ((vector<duckdb::vector<unsigned_long,_true>,_true> *)&local_e0,local_a0);
    pvVar4 = vector<unsigned_long,_true>::operator[](pvVar3,local_a8 + 1);
    vVar11 = *pvVar4;
    ::std::
    _Rb_tree<char,_std::pair<const_char,_unsigned_long>,_std::_Select1st<std::pair<const_char,_unsigned_long>_>,_std::less<char>,_std::allocator<std::pair<const_char,_unsigned_long>_>_>
    ::~_Rb_tree(&local_68);
    ::std::
    vector<duckdb::vector<unsigned_long,_true>,_std::allocator<duckdb::vector<unsigned_long,_true>_>_>
    ::~vector(&local_e0);
  }
  return vVar11;
}

Assistant:

static inline RESULT_TYPE Operation(FUNC fun, LEFT_TYPE left, RIGHT_TYPE right, ValidityMask &mask, idx_t idx) {
		return fun(left, right);
	}